

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

pool_ptr<soul::AST::ModuleBase> __thiscall
soul::AST::Scope::findSubModuleNamed(Scope *this,Identifier name)

{
  long lVar1;
  pool_ref<soul::AST::ModuleBase> *m;
  long *plVar2;
  _func_int **pp_Var3;
  _func_int *in_RDX;
  undefined1 auVar4 [16];
  
  auVar4 = (**(code **)(((name.name)->_M_dataplus)._M_p + 0x88))(name.name);
  for (plVar2 = auVar4._0_8_; plVar2 != auVar4._8_8_; plVar2 = plVar2 + 1) {
    pp_Var3 = (_func_int **)*plVar2;
    if ((pp_Var3[8] == in_RDX) && (pp_Var3[10] == pp_Var3[0xb])) goto LAB_00239590;
  }
  auVar4 = (**(code **)(((name.name)->_M_dataplus)._M_p + 0x80))(name.name);
  plVar2 = auVar4._0_8_;
  pp_Var3 = (_func_int **)0x0;
  do {
    if (plVar2 == auVar4._8_8_) goto LAB_00239590;
    lVar1 = *plVar2;
    plVar2 = plVar2 + 1;
  } while (*(_func_int **)(lVar1 + 0x28) != in_RDX);
  pp_Var3 = *(_func_int ***)(lVar1 + 0x40);
LAB_00239590:
  this->_vptr_Scope = pp_Var3;
  return (pool_ptr<soul::AST::ModuleBase>)(ModuleBase *)this;
}

Assistant:

pool_ptr<ModuleBase> findSubModuleNamed (Identifier name) const
        {
            for (auto& m : getSubModules())
                if (m->name == name && (! m->isTemplateModule()))
                    return m;

            for (auto& a : getNamespaceAliases())
                if (a->name == name)
                    return a->resolvedNamespace;

            return {};
        }